

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O0

bool __thiscall
flow::diagnostics::BufferedReport::operator==(BufferedReport *this,BufferedReport *other)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  const_reference this_00;
  const_reference other_00;
  size_t e;
  size_t i;
  BufferedReport *other_local;
  BufferedReport *this_local;
  
  sVar2 = size(this);
  sVar3 = size(other);
  if (sVar2 == sVar3) {
    e = 0;
    sVar2 = size(this);
    for (; e != sVar2; e = e + 1) {
      this_00 = std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                ::operator[](&this->messages_,e);
      other_00 = std::
                 vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
                 operator[](&other->messages_,e);
      bVar1 = Message::operator!=(this_00,other_00);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BufferedReport::operator==(const BufferedReport& other) const noexcept {
  if (size() != other.size())
    return false;

  for (size_t i = 0, e = size(); i != e; ++i)
    if (messages_[i] != other.messages_[i])
      return false;

  return true;
}